

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

jx9_int64 StreamRead(io_private *pDev,void *pBuf,jx9_int64 nLen)

{
  uint uVar1;
  jx9_io_stream *pjVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  jx9_int64 jVar6;
  
  pjVar2 = pDev->pStream;
  uVar3 = (pDev->sBuffer).nByte;
  uVar1 = pDev->nOfft;
  if (uVar3 == uVar1) {
    uVar5 = 0;
    jVar6 = nLen;
  }
  else {
    uVar5 = (ulong)(uVar3 - uVar1);
    if (nLen <= (long)uVar5) {
      uVar5 = nLen;
    }
    SyMemcpy((void *)((ulong)uVar1 + (long)(pDev->sBuffer).pBlob),pBuf,(sxu32)uVar5);
    uVar3 = pDev->nOfft + (sxu32)uVar5;
    pDev->nOfft = uVar3;
    if ((pDev->sBuffer).nByte <= uVar3) {
      (pDev->sBuffer).nByte = 0;
      uVar3 = (pDev->sBuffer).nFlags;
      if ((uVar3 & 4) != 0) {
        (pDev->sBuffer).pBlob = (void *)0x0;
        (pDev->sBuffer).mByte = 0;
        (pDev->sBuffer).nFlags = uVar3 & 0xfffffffb;
      }
      pDev->nOfft = 0;
    }
    jVar6 = nLen - uVar5;
    if (jVar6 == 0 || nLen < (long)uVar5) {
      return uVar5;
    }
    pBuf = (void *)((long)pBuf + uVar5);
  }
  uVar4 = (*pjVar2->xRead)(pDev->pHandle,pBuf,jVar6);
  if ((long)uVar4 < 1) {
    if ((long)uVar5 < 1) {
      uVar5 = uVar4;
    }
  }
  else {
    uVar5 = uVar5 + uVar4;
  }
  return uVar5;
}

Assistant:

static jx9_int64 StreamRead(io_private *pDev, void *pBuf, jx9_int64 nLen)
{
	const jx9_io_stream *pStream = pDev->pStream;
	char *zBuf = (char *)pBuf;
	jx9_int64 n, nRead;
	n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
	if( n > 0 ){
		if( n > nLen ){
			n = nLen;
		}
		/* Copy the buffered data */
		SyMemcpy(SyBlobDataAt(&pDev->sBuffer, pDev->nOfft), pBuf, (sxu32)n);
		/* Update the read offset */
		pDev->nOfft += (sxu32)n;
		if( pDev->nOfft >= SyBlobLength(&pDev->sBuffer) ){
			/* Reset the working buffer so that we avoid excessive memory allocation */
			SyBlobReset(&pDev->sBuffer);
			pDev->nOfft = 0;
		}
		nLen -= n;
		if( nLen < 1 ){
			/* All done */
			return n;
		}
		/* Advance the cursor */
		zBuf += n;
	}
	/* Read without buffering */
	nRead = pStream->xRead(pDev->pHandle, zBuf, nLen);
	if( nRead > 0 ){
		n += nRead;
	}else if( n < 1 ){
		/* EOF or IO error */
		return nRead;
	}
	return n;
}